

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

void __thiscall slang::SVInt::flattenUnknowns(SVInt *this)

{
  ulong *puVar1;
  uint64_t *puVar2;
  bitwidth_t bVar3;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 __dest;
  ulong uVar4;
  ulong uVar5;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *__src;
  uint uVar6;
  
  if ((this->super_SVIntStorage).unknownFlag != true) {
    return;
  }
  uVar4 = (ulong)((this->super_SVIntStorage).bitWidth + 0x3f >> 3 & 0xfffffff8);
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 8) {
    puVar2 = (this->super_SVIntStorage).field_0.pVal;
    puVar1 = (ulong *)((long)puVar2 + uVar5);
    *puVar1 = *puVar1 & ~*(ulong *)((long)puVar2 + uVar4 + uVar5);
    *(undefined8 *)((long)(this->super_SVIntStorage).field_0.pVal + uVar5 + uVar4) = 0;
  }
  if ((this->super_SVIntStorage).unknownFlag != true) {
    return;
  }
  bVar3 = countLeadingZeros(this);
  uVar6 = (this->super_SVIntStorage).bitWidth;
  if (bVar3 < uVar6) {
    return;
  }
  (this->super_SVIntStorage).unknownFlag = false;
  uVar6 = uVar6 + 0x3f >> 6;
  if (uVar6 == 1) {
    __src = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(this->super_SVIntStorage).field_0.pVal;
    __dest = *__src;
  }
  else {
    uVar4 = (ulong)(uVar6 << 3);
    __dest.pVal = (uint64_t *)operator_new__(uVar4);
    __src = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(this->super_SVIntStorage).field_0.pVal;
    memcpy(__dest.pVal,__src,uVar4);
    if (__src == (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)0x0) goto LAB_0028b7d8;
  }
  operator_delete__(__src);
LAB_0028b7d8:
  (this->super_SVIntStorage).field_0 = __dest;
  return;
}

Assistant:

void SVInt::flattenUnknowns() {
    if (!unknownFlag)
        return;

    uint32_t words = getNumWords(bitWidth, false);
    for (uint32_t i = 0; i < words; i++) {
        pVal[i] &= ~pVal[i + words];
        pVal[i + words] = 0;
    }

    checkUnknown();
}